

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_common.cc
# Opt level: O2

void google::protobuf::compiler::java::SetCommonOneofVariables
               (FieldDescriptor *descriptor,OneofGeneratorInfo *info,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar1;
  OneofDescriptor *pOVar2;
  AlphaNum *a;
  FieldDescriptor *field;
  AlphaNum *in_R8;
  string sStack_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[11]> *)0x4e46f3);
  std::__cxx11::string::_M_assign((string *)pbVar1);
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[23]> *)"oneof_capitalized_name");
  std::__cxx11::string::_M_assign((string *)pbVar1);
  pOVar2 = FieldDescriptor::containing_oneof(descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_b8,(int)(((long)pOVar2 - (long)pOVar2->containing_type_->oneof_decls_) / 0x38));
  absl::lts_20250127::StrCat_abi_cxx11_((string *)&local_88,(lts_20250127 *)&local_b8,a);
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[12]> *)"oneof_index");
  std::__cxx11::string::operator=((string *)pbVar1,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  GetOneofStoredType_abi_cxx11_((string *)&local_b8,(java *)descriptor,field);
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[18],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[18]> *)"oneof_stored_type");
  std::__cxx11::string::operator=((string *)pbVar1,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_b8.piece_._M_str = (info->name)._M_dataplus._M_p;
  local_b8.piece_._M_len = (info->name)._M_string_length;
  local_88.piece_ = absl::lts_20250127::NullSafeStringView("Case_ = ");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_58,descriptor->number_);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&sStack_d8,(lts_20250127 *)&local_b8,&local_88,&local_58,in_R8);
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[23]> *)"set_oneof_case_message");
  std::__cxx11::string::operator=((string *)pbVar1,(string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&sStack_d8);
  local_b8.piece_._M_str = (info->name)._M_dataplus._M_p;
  local_b8.piece_._M_len = (info->name)._M_string_length;
  local_88.piece_ = absl::lts_20250127::NullSafeStringView("Case_ = 0");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)&local_58,(lts_20250127 *)&local_b8,&local_88,&local_88);
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[25],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[25]> *)"clear_oneof_case_message");
  std::__cxx11::string::operator=((string *)pbVar1,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_b8.piece_._M_str = (info->name)._M_dataplus._M_p;
  local_b8.piece_._M_len = (info->name)._M_string_length;
  local_88.piece_ = absl::lts_20250127::NullSafeStringView("Case_ == ");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_58,descriptor->number_);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&sStack_d8,(lts_20250127 *)&local_b8,&local_88,&local_58,in_R8);
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[23]> *)"has_oneof_case_message");
  std::__cxx11::string::operator=((string *)pbVar1,(string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&sStack_d8);
  return;
}

Assistant:

void SetCommonOneofVariables(
    const FieldDescriptor* descriptor, const OneofGeneratorInfo* info,
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  (*variables)["oneof_name"] = info->name;
  (*variables)["oneof_capitalized_name"] = info->capitalized_name;
  (*variables)["oneof_index"] =
      absl::StrCat(descriptor->containing_oneof()->index());
  (*variables)["oneof_stored_type"] = GetOneofStoredType(descriptor);
  (*variables)["set_oneof_case_message"] =
      absl::StrCat(info->name, "Case_ = ", descriptor->number());
  (*variables)["clear_oneof_case_message"] =
      absl::StrCat(info->name, "Case_ = 0");
  (*variables)["has_oneof_case_message"] =
      absl::StrCat(info->name, "Case_ == ", descriptor->number());
}